

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O2

int Shr_ManDivPushOrderByLevel(Shr_Man_t *p,int iDiv)

{
  uint uVar1;
  int *piVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  ulong uVar8;
  
  Vec_IntPush(p->vPrio,iDiv);
  uVar1 = p->vPrio->nSize;
  uVar8 = (ulong)uVar1;
  iVar4 = 0;
  if (uVar8 != 1) {
    piVar2 = p->vPrio->pArray;
    piVar7 = piVar2 + (uVar1 - 1);
    for (; 1 < (int)uVar8; uVar8 = uVar8 - 1) {
      pGVar3 = p->pNew;
      pGVar6 = Gia_ManObj(pGVar3,piVar2[uVar8 - 2]);
      iVar4 = Gia_ObjLevel(pGVar3,pGVar6);
      pGVar3 = p->pNew;
      pGVar6 = Gia_ManObj(pGVar3,*piVar7);
      iVar5 = Gia_ObjLevel(pGVar3,pGVar6);
      if (iVar4 <= iVar5) break;
      iVar4 = piVar2[uVar8 - 2];
      piVar2[uVar8 - 2] = *piVar7;
      *piVar7 = iVar4;
      piVar7 = piVar7 + -1;
    }
    iVar4 = (int)uVar8 + -1;
  }
  return iVar4;
}

Assistant:

static inline int Shr_ManDivPushOrderByLevel( Shr_Man_t * p, int iDiv )
{
    int iPlace, * pArray;
    Vec_IntPush( p->vPrio, iDiv );
    if ( Vec_IntSize(p->vPrio) == 1 )
        return 0; 
    pArray = Vec_IntArray(p->vPrio);
    for ( iPlace = Vec_IntSize(p->vPrio) - 1; iPlace > 0; iPlace-- )
        if ( Gia_ObjLevel(p->pNew, Gia_ManObj(p->pNew, pArray[iPlace-1])) > 
             Gia_ObjLevel(p->pNew, Gia_ManObj(p->pNew, pArray[iPlace])) )
             ABC_SWAP( int, pArray[iPlace-1], pArray[iPlace] )
        else
            break;
    return iPlace; // the place of the new divisor
}